

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::cpp::ClassName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,EnumDescriptor *enum_descriptor)

{
  Descriptor *pDVar1;
  DescriptorStringView psVar2;
  char *in_RCX;
  Descriptor *descriptor;
  string_view name;
  AlphaNum local_e8;
  AlphaNum local_b8;
  string local_78;
  AlphaNum local_58;
  undefined1 local_28 [16];
  EnumDescriptor *local_18;
  EnumDescriptor *enum_descriptor_local;
  
  local_18 = (EnumDescriptor *)this;
  enum_descriptor_local = (EnumDescriptor *)__return_storage_ptr__;
  pDVar1 = EnumDescriptor::containing_type((EnumDescriptor *)this);
  if (pDVar1 == (Descriptor *)0x0) {
    psVar2 = EnumDescriptor::name_abi_cxx11_(local_18);
    local_28 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar2);
    name._M_len = local_28._8_8_;
    name._M_str = in_RCX;
    ResolveKeyword_abi_cxx11_(__return_storage_ptr__,local_28._0_8_,name);
  }
  else {
    pDVar1 = EnumDescriptor::containing_type(local_18);
    ClassName_abi_cxx11_(&local_78,(cpp *)pDVar1,descriptor);
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_58,&local_78);
    absl::lts_20240722::AlphaNum::AlphaNum(&local_b8,"_");
    psVar2 = EnumDescriptor::name_abi_cxx11_(local_18);
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_e8,psVar2);
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_58,&local_b8);
    std::__cxx11::string::~string((string *)&local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ClassName(const EnumDescriptor* enum_descriptor) {
  if (enum_descriptor->containing_type() == nullptr) {
    return ResolveKeyword(enum_descriptor->name());
  } else {
    return absl::StrCat(ClassName(enum_descriptor->containing_type()), "_",
                        enum_descriptor->name());
  }
}